

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

uchar * __thiscall
QFSFileEnginePrivate::map(QFSFileEnginePrivate *this,qint64 offset,qint64 size,MemoryMapFlags flags)

{
  uint uVar1;
  QAbstractFileEngine *this_00;
  int iVar2;
  int __fd;
  void *pvVar3;
  StartAndLength *pSVar4;
  int *piVar5;
  uchar *puVar6;
  long lVar7;
  FileError error;
  long in_FS_OFFSET;
  uchar *address;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  if ((this->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i == 0) {
    qt_error_string((QString *)&address,0xd);
LAB_0015f5cf:
    error = PermissionsError;
  }
  else if ((offset < 0) || (size < 1)) {
    qt_error_string((QString *)&address,0x16);
    error = UnspecifiedError;
  }
  else {
    doStat(this,(MetaDataFlags)0x200000);
    uVar1 = (this->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
            super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
    iVar2 = getpagesize();
    lVar7 = offset % (long)iVar2;
    __fd = nativeHandle(this);
    pvVar3 = mmap64((void *)0x0,size + lVar7,
                    ((uint)flags.super_QFlagsStorageHelper<QFileDevice::MemoryMapFlag,_4>.
                           super_QFlagsStorage<QFileDevice::MemoryMapFlag>.i & 1) * 2 | uVar1 & 3,
                    ((uint)flags.super_QFlagsStorageHelper<QFileDevice::MemoryMapFlag,_4>.
                           super_QFlagsStorage<QFileDevice::MemoryMapFlag>.i & 1) + 1,__fd,
                    -iVar2 & offset);
    if (pvVar3 != (void *)0xffffffffffffffff) {
      address = (uchar *)((long)pvVar3 + lVar7);
      pSVar4 = QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::operator[]
                         (&this->maps,&address);
      pSVar4->start = (int)lVar7;
      pSVar4->length = size + lVar7;
      puVar6 = address;
      goto LAB_0015f594;
    }
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    if ((iVar2 == 0x17) || (iVar2 == 0xc)) {
      qt_error_string((QString *)&address,iVar2);
      error = ResourceError;
    }
    else {
      if (iVar2 == 9) {
        qt_error_string((QString *)&address,0xd);
        goto LAB_0015f5cf;
      }
      qt_error_string((QString *)&address,iVar2);
      error = UnspecifiedError;
    }
  }
  QAbstractFileEngine::setError(this_00,error,(QString *)&address);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&address);
  puVar6 = (uchar *)0x0;
LAB_0015f594:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return puVar6;
}

Assistant:

uchar *QFSFileEnginePrivate::map(qint64 offset, qint64 size, QFile::MemoryMapFlags flags)
{
    qint64 maxFileOffset = std::numeric_limits<QT_OFF_T>::max();
#if (defined(Q_OS_LINUX) || defined(Q_OS_ANDROID)) && Q_PROCESSOR_WORDSIZE == 4
    // The Linux mmap2 system call on 32-bit takes a page-shifted 32-bit
    // integer so the maximum offset is 1 << (32+12) (the shift is always 12,
    // regardless of the actual page size). Unfortunately, the mmap64()
    // function is known to be broken in all Linux libcs (glibc, uclibc, musl
    // and Bionic): all of them do the right shift, but don't confirm that the
    // result fits into the 32-bit parameter to the kernel.

    maxFileOffset = qMin((Q_INT64_C(1) << (32+12)) - 1, maxFileOffset);
#endif

    Q_Q(QFSFileEngine);
    if (openMode == QIODevice::NotOpen) {
        q->setError(QFile::PermissionsError, qt_error_string(EACCES));
        return nullptr;
    }

    if (offset < 0 || offset > maxFileOffset
        || size <= 0
        || quint64(size) > quint64(size_t(-1))) {
        q->setError(QFile::UnspecifiedError, qt_error_string(EINVAL));
        return nullptr;
    }
    // If we know the mapping will extend beyond EOF, fail early to avoid
    // undefined behavior. Otherwise, let mmap have its say.
    if (doStat(QFileSystemMetaData::SizeAttribute)
            && (QT_OFF_T(size) > metaData.size() - QT_OFF_T(offset)))
        qWarning("QFSFileEngine::map: Mapping a file beyond its size is not portable");

    int access = 0;
    if (openMode & QIODevice::ReadOnly) access |= PROT_READ;
    if (openMode & QIODevice::WriteOnly) access |= PROT_WRITE;

    int sharemode = MAP_SHARED;
    if (flags & QFileDevice::MapPrivateOption) {
        sharemode = MAP_PRIVATE;
        access |= PROT_WRITE;
    }

#if defined(Q_OS_INTEGRITY)
    int pageSize = sysconf(_SC_PAGESIZE);
#else
    int pageSize = getpagesize();
#endif
    int extra = offset % pageSize;

    if (quint64(size + extra) > quint64((size_t)-1)) {
        q->setError(QFile::UnspecifiedError, qt_error_string(EINVAL));
        return nullptr;
    }

    size_t realSize = (size_t)size + extra;
    QT_OFF_T realOffset = QT_OFF_T(offset);
    realOffset &= ~(QT_OFF_T(pageSize - 1));

    void *mapAddress = QT_MMAP((void*)nullptr, realSize,
                   access, sharemode, nativeHandle(), realOffset);
    if (MAP_FAILED != mapAddress) {
        uchar *address = extra + static_cast<uchar*>(mapAddress);
        maps[address] = {extra, realSize};
        return address;
    }

    switch(errno) {
    case EBADF:
        q->setError(QFile::PermissionsError, qt_error_string(EACCES));
        break;
    case ENFILE:
    case ENOMEM:
        q->setError(QFile::ResourceError, qt_error_string(errno));
        break;
    case EINVAL:
        // size are out of bounds
    default:
        q->setError(QFile::UnspecifiedError, qt_error_string(errno));
        break;
    }
    return nullptr;
}